

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int backtrack_other(saucy *s)

{
  int t;
  int iVar1;
  int b;
  int local_20;
  int min;
  int spec;
  int cb;
  int cf;
  saucy *s_local;
  
  t = s->start[s->lev];
  b = t + (s->right).clen[t];
  iVar1 = s->specmin[s->lev];
  pick_all_the_pairs(s);
  clear_undiffnons(s);
  s->ndiffnons = -1;
  s->npairs = -1;
  if ((s->right).lab[b] == iVar1) {
    local_20 = find_min(s,t);
    if (local_20 == b) {
      local_20 = orbit_prune(s);
    }
    else {
      local_20 = local_20 - t;
    }
  }
  else {
    local_20 = orbit_prune(s);
    if ((local_20 != -1) && ((s->right).lab[local_20 + t] == iVar1)) {
      swap_labels(&s->right,local_20 + t,b);
      local_20 = orbit_prune(s);
    }
  }
  return local_20;
}

Assistant:

static int
backtrack_other(struct saucy *s)
{
    int cf = s->start[s->lev];
    int cb = cf + s->right.clen[cf];
    int spec = s->specmin[s->lev];
    int min;

    /* Avoid using pairs until we get back to leftmost. */
    pick_all_the_pairs(s);

    clear_undiffnons(s);

    s->npairs = s->ndiffnons = -1;

    if (s->right.lab[cb] == spec) {
        min = find_min(s, cf);
        if (min == cb) {
            min = orbit_prune(s);
        }
        else {
            min -= cf;
        }
    }
    else {
        min = orbit_prune(s);
        if (min != -1 && s->right.lab[min + cf] == spec) {
            swap_labels(&s->right, min + cf, cb);
            min = orbit_prune(s);
        }
    }
    return min;
}